

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_da4def::cmEnumPathSegmentsGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmEnumPathSegmentsGenerator *this,string *parent)

{
  pointer pbVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  undefined1 local_58 [32];
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_28;
  undefined1 *local_20;
  size_t local_18;
  char *pcStack_10;
  
  pbVar1 = (this->Current)._M_current;
  if (pbVar1 == (((this->Names)._M_data)->
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    local_38._M_str = (parent->_M_dataplus)._M_p;
    local_38._M_len = parent->_M_string_length;
    local_20 = local_58;
    local_58[0] = 0x2f;
    (this->Current)._M_current = pbVar1 + 1;
    local_28 = 1;
    local_18 = pbVar1->_M_len;
    pcStack_10 = pbVar1->_M_str;
    views._M_len = 3;
    views._M_array = &local_38;
    cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    if (this->Current != this->Names.get().cend()) {
      return cmStrCat(parent, '/', *this->Current++);
    }
    return {};
  }